

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.cpp
# Opt level: O3

bool miniros::service::exists(string *service_name,bool print_failure_reason)

{
  _Base_ptr *pp_Var1;
  bool bVar2;
  int iVar3;
  ServiceManagerPtr *pSVar4;
  mapped_type *pmVar5;
  shared_ptr<unsigned_char[]> *__args_1;
  uint32_t size;
  shared_ptr<unsigned_char[]> buffer;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  uint32_t port;
  M_string m;
  TransportTCPPtr transport;
  string mapped_name;
  string host;
  
  names::resolve(&mapped_name,service_name,true);
  host._M_string_length = 0;
  host.field_2._M_local_buf[0] = '\0';
  host._M_dataplus._M_p = (pointer)&host.field_2;
  pSVar4 = ServiceManager::instance();
  bVar2 = ServiceManager::lookupService
                    ((pSVar4->
                     super___shared_ptr<miniros::ServiceManager,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                     ,&mapped_name,&host,&port);
  if (bVar2) {
    m._M_t._M_impl._0_8_ = 0;
    __args_1 = &buffer;
    buffer.super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         CONCAT44(buffer.super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                  _4_4_,1);
    std::__shared_ptr<miniros::TransportTCP,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<miniros::TransportTCP>,miniros::PollSet*,miniros::TransportTCP::Flags>
              ((__shared_ptr<miniros::TransportTCP,(__gnu_cxx::_Lock_policy)2> *)&transport,
               (allocator<miniros::TransportTCP> *)&size,(PollSet **)&m,(Flags *)__args_1);
    iVar3 = TransportTCP::connect
                      (transport.
                       super___shared_ptr<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       (int)&host,(sockaddr *)(ulong)port,(socklen_t)__args_1);
    if ((char)iVar3 == '\0') {
      if (print_failure_reason) {
        if (console::g_initialized == '\0') {
          console::initialize();
        }
        if (exists::loc.initialized_ == false) {
          pp_Var1 = &m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          m._M_t._M_impl._0_8_ = pp_Var1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&m,"miniros.unknown_package","")
          ;
          console::initializeLogLocation(&exists::loc,(string *)&m,Info);
          if ((_Base_ptr *)m._M_t._M_impl._0_8_ != pp_Var1) {
            operator_delete((void *)m._M_t._M_impl._0_8_,
                            (ulong)((long)&(m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                                           )->_M_color + 1));
          }
        }
        if (exists::loc.level_ != Info) {
          console::setLogLocationLevel(&exists::loc,Info);
          console::checkLogLocationEnabled(&exists::loc);
        }
        if (exists::loc.logger_enabled_ == true) {
          console::print((FilterBase *)0x0,exists::loc.logger_,exists::loc.level_,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/service.cpp"
                         ,0x48,"bool miniros::service::exists(const std::string &, bool)",
                         "waitForService: Service [%s] could not connect to host [%s:%d], waiting..."
                         ,mapped_name._M_dataplus._M_p,host._M_dataplus._M_p,(ulong)port);
        }
      }
    }
    else {
      m._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &m._M_t._M_impl.super__Rb_tree_header._M_header;
      m._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      m._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      buffer.super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&local_c8;
      m._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           m._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      std::__cxx11::string::_M_construct<char_const*>((string *)&buffer,"probe","");
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&m,(key_type *)&buffer);
      std::__cxx11::string::_M_replace((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,0x2576b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)buffer.super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          &local_c8) {
        operator_delete(buffer.super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,local_c8._M_allocated_capacity + 1);
      }
      buffer.super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&local_c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&buffer,"md5sum","");
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&m,(key_type *)&buffer);
      std::__cxx11::string::_M_replace((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,0x253d7a);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)buffer.super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          &local_c8) {
        operator_delete(buffer.super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,local_c8._M_allocated_capacity + 1);
      }
      this_node::getName_abi_cxx11_();
      buffer.super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&local_c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&buffer,"callerid","");
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&m,(key_type *)&buffer);
      std::__cxx11::string::_M_assign((string *)pmVar5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)buffer.super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          &local_c8) {
        operator_delete(buffer.super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,local_c8._M_allocated_capacity + 1);
      }
      buffer.super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&local_c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&buffer,"service","");
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&m,(key_type *)&buffer);
      std::__cxx11::string::_M_assign((string *)pmVar5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)buffer.super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          &local_c8) {
        operator_delete(buffer.super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,local_c8._M_allocated_capacity + 1);
      }
      buffer.super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      buffer.super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      size = 0;
      Header::write((int)&m,&buffer,(size_t)&size);
      (*((transport.super___shared_ptr<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        super_Transport)._vptr_Transport[3])
                (transport.super___shared_ptr<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,&size,4);
      (*((transport.super___shared_ptr<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        super_Transport)._vptr_Transport[3])
                (transport.super___shared_ptr<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,buffer.super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,(ulong)size);
      (*((transport.super___shared_ptr<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        super_Transport)._vptr_Transport[8])();
      if (buffer.super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (buffer.super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&m._M_t);
    }
    if (transport.super___shared_ptr<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (transport.super___shared_ptr<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    bVar2 = true;
    if ((char)iVar3 != '\0') goto LAB_001fa365;
  }
  else if (print_failure_reason) {
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (exists(std::__cxx11::string_const&,bool)::loc.initialized_ == false) {
      pp_Var1 = &m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      m._M_t._M_impl._0_8_ = pp_Var1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&m,"miniros.unknown_package","");
      console::initializeLogLocation
                (&exists(std::__cxx11::string_const&,bool)::loc,(string *)&m,Info);
      if ((_Base_ptr *)m._M_t._M_impl._0_8_ != pp_Var1) {
        operator_delete((void *)m._M_t._M_impl._0_8_,
                        (ulong)((long)&(m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                       _M_color + 1));
      }
    }
    if (exists(std::__cxx11::string_const&,bool)::loc.level_ != Info) {
      console::setLogLocationLevel(&exists(std::__cxx11::string_const&,bool)::loc,Info);
      console::checkLogLocationEnabled(&exists(std::__cxx11::string_const&,bool)::loc);
    }
    if (exists(std::__cxx11::string_const&,bool)::loc.logger_enabled_ == true) {
      console::print((FilterBase *)0x0,exists(std::__cxx11::string_const&,bool)::loc.logger_,
                     exists(std::__cxx11::string_const&,bool)::loc.level_,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/service.cpp"
                     ,0x50,"bool miniros::service::exists(const std::string &, bool)",
                     "waitForService: Service [%s] has not been advertised, waiting...",
                     mapped_name._M_dataplus._M_p);
    }
  }
  bVar2 = false;
LAB_001fa365:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)host._M_dataplus._M_p != &host.field_2) {
    operator_delete(host._M_dataplus._M_p,
                    CONCAT71(host.field_2._M_allocated_capacity._1_7_,host.field_2._M_local_buf[0])
                    + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)mapped_name._M_dataplus._M_p != &mapped_name.field_2) {
    operator_delete(mapped_name._M_dataplus._M_p,mapped_name.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool service::exists(const std::string& service_name, bool print_failure_reason)
{
  std::string mapped_name = names::resolve(service_name);

  std::string host;
  uint32_t port;

  if (ServiceManager::instance()->lookupService(mapped_name, host, port))
  {
    TransportTCPPtr transport(std::make_shared<TransportTCP>(static_cast<miniros::PollSet*>(NULL), TransportTCP::SYNCHRONOUS));

    if (transport->connect(host, port))
    {
      M_string m;
      m["probe"] = "1";
      m["md5sum"] = "*";
      m["callerid"] = this_node::getName();
      m["service"] = mapped_name;
      std::shared_ptr<uint8_t[]> buffer;
      uint32_t size = 0;;
      Header::write(m, buffer, size);
      transport->write((uint8_t*)&size, sizeof(size));
      transport->write(buffer.get(), size);
      transport->close();

      return true;
    }
    else
    {
      if (print_failure_reason)
      {
        MINIROS_INFO("waitForService: Service [%s] could not connect to host [%s:%d], waiting...", mapped_name.c_str(), host.c_str(), port);
      }
    }
  }
  else
  {
    if (print_failure_reason)
    {
      MINIROS_INFO("waitForService: Service [%s] has not been advertised, waiting...", mapped_name.c_str());
    }
  }

  return false;
}